

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O3

int Abc_NtkAddOneHotness(Mfs_Man_t *p)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  int Lits [2];
  int local_40;
  int local_3c;
  long local_38;
  
  pVVar5 = p->pAigWin->vCis;
  iVar2 = pVVar5->nSize;
  if (0 < iVar2) {
    lVar4 = 1;
    lVar7 = 0;
    do {
      local_38 = lVar7 + 1;
      lVar3 = (long)iVar2;
      lVar6 = lVar4;
      if (local_38 < lVar3) {
        do {
          if (iVar2 <= lVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          piVar1 = p->pCnf->pVarNums;
          local_40 = piVar1[*(int *)((long)pVVar5->pArray[lVar7] + 0x24)] * 2 + 1;
          local_3c = piVar1[*(int *)((long)pVVar5->pArray[lVar6] + 0x24)] * 2 + 1;
          iVar2 = sat_solver_addclause(p->pSat,&local_40,(lit *)&local_38);
          if (iVar2 == 0) {
            sat_solver_delete(p->pSat);
            p->pSat = (sat_solver *)0x0;
            return 0;
          }
          lVar6 = lVar6 + 1;
          pVVar5 = p->pAigWin->vCis;
          iVar2 = pVVar5->nSize;
        } while ((int)lVar6 < iVar2);
        lVar3 = (long)iVar2;
      }
      lVar4 = lVar4 + 1;
      lVar7 = local_38;
    } while (local_38 < lVar3);
  }
  return 1;
}

Assistant:

int Abc_NtkAddOneHotness( Mfs_Man_t * p )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i, k, Lits[2];
    for ( i = 0; i < Vec_PtrSize(p->pAigWin->vCis); i++ )
    for ( k = i+1; k < Vec_PtrSize(p->pAigWin->vCis); k++ )
    {
        pObj1 = Aig_ManCi( p->pAigWin, i );
        pObj2 = Aig_ManCi( p->pAigWin, k );
        Lits[0] = toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 );
        Lits[1] = toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
        {
            sat_solver_delete( p->pSat );
            p->pSat = NULL;
            return 0;
        }
    }
    return 1;
}